

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyStateIntegerEqualToOther
               (ResultCollector *result,CallLogWrapper *gl,GLenum target,GLenum other,QueryType type
               )

{
  float fVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool *pbVar5;
  GLint *pGVar6;
  GLint64 *pGVar7;
  GLfloat *pGVar8;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  QueriedState stateB;
  QueriedState stateA;
  QueryType type_local;
  GLenum other_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  QueriedState::QueriedState((QueriedState *)((long)&stateB.m_v + 0x18));
  QueriedState::QueriedState((QueriedState *)local_78);
  queryState(result,gl,type,target,(QueriedState *)((long)&stateB.m_v + 0x18));
  queryState(result,gl,type,other,(QueriedState *)local_78);
  bVar4 = QueriedState::isUndefined((QueriedState *)((long)&stateB.m_v + 0x18));
  if ((!bVar4) && (bVar4 = QueriedState::isUndefined((QueriedState *)local_78), !bVar4)) {
    switch(type) {
    case QUERY_BOOLEAN:
      pbVar5 = QueriedState::getBoolAccess((QueriedState *)((long)&stateB.m_v + 0x18));
      bVar4 = *pbVar5;
      pbVar5 = QueriedState::getBoolAccess((QueriedState *)local_78);
      if ((bVar4 & 1U) != (*pbVar5 & 1U)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"expected equal results",&local_99);
        tcu::ResultCollector::fail(result,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      break;
    default:
      break;
    case QUERY_INTEGER:
      pGVar6 = QueriedState::getIntAccess((QueriedState *)((long)&stateB.m_v + 0x18));
      iVar2 = *pGVar6;
      pGVar6 = QueriedState::getIntAccess((QueriedState *)local_78);
      if (iVar2 != *pGVar6) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"expected equal results",&local_d1);
        tcu::ResultCollector::fail(result,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      break;
    case QUERY_INTEGER64:
      pGVar7 = QueriedState::getInt64Access((QueriedState *)((long)&stateB.m_v + 0x18));
      lVar3 = *pGVar7;
      pGVar7 = QueriedState::getInt64Access((QueriedState *)local_78);
      if (lVar3 != *pGVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected equal results",&local_f9);
        tcu::ResultCollector::fail(result,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
      }
      break;
    case QUERY_FLOAT:
      pGVar8 = QueriedState::getFloatAccess((QueriedState *)((long)&stateB.m_v + 0x18));
      fVar1 = *pGVar8;
      pGVar8 = QueriedState::getFloatAccess((QueriedState *)local_78);
      if ((fVar1 != *pGVar8) || (NAN(fVar1) || NAN(*pGVar8))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"expected equal results",&local_121);
        tcu::ResultCollector::fail(result,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
      }
    }
  }
  return;
}

Assistant:

void verifyStateIntegerEqualToOther (tcu::ResultCollector& result, glu::CallLogWrapper& gl, glw::GLenum target, glw::GLenum other, QueryType type)
{
	QueriedState stateA;
	QueriedState stateB;

	queryState(result, gl, type, target, stateA);
	queryState(result, gl, type, other, stateB);

	if (stateA.isUndefined() || stateB.isUndefined())
		return;

	switch (type)
	{
		case QUERY_BOOLEAN:
		{
			if (stateA.getBoolAccess() != stateB.getBoolAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER:
		{
			if (stateA.getIntAccess() != stateB.getIntAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER64:
		{
			if (stateA.getInt64Access() != stateB.getInt64Access())
				result.fail("expected equal results");
			break;
		}

		case QUERY_FLOAT:
		{
			if (stateA.getFloatAccess() != stateB.getFloatAccess())
				result.fail("expected equal results");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}